

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntRemapArray(Vec_Int_t *vOld2New,Vec_Int_t *vOld,Vec_Int_t *vNew,int nNew)

{
  int i;
  int iVar1;
  int i_00;
  
  if (vOld->nSize != 0) {
    Vec_IntFill(vNew,nNew,0);
    for (i_00 = 0; i_00 < vOld2New->nSize; i_00 = i_00 + 1) {
      i = Vec_IntEntry(vOld2New,i_00);
      if (((i < nNew && 0 < i) && (i_00 < vOld->nSize)) &&
         (iVar1 = Vec_IntEntry(vOld,i_00), iVar1 != 0)) {
        iVar1 = Vec_IntEntry(vOld,i_00);
        Vec_IntWriteEntry(vNew,i,iVar1);
      }
    }
  }
  return;
}

Assistant:

static inline void Vec_IntRemapArray( Vec_Int_t * vOld2New, Vec_Int_t * vOld, Vec_Int_t * vNew, int nNew )
{
    int iOld, iNew;
    if ( Vec_IntSize(vOld) == 0 )
        return;
    Vec_IntFill( vNew, nNew, 0 );
    Vec_IntForEachEntry( vOld2New, iNew, iOld )
        if ( iNew > 0 && iNew < nNew && iOld < Vec_IntSize(vOld) && Vec_IntEntry(vOld, iOld) != 0 )
            Vec_IntWriteEntry( vNew, iNew, Vec_IntEntry(vOld, iOld) );
}